

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnscapPlugIn.cpp
# Opt level: O0

int libithicap_close(my_bpftimeval ts)

{
  int iVar1;
  bool bVar2;
  undefined1 local_40 [8];
  CaptureSummary cs;
  int exit_code;
  my_bpftimeval ts_local;
  
  cs.summary.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  CaptureSummary::CaptureSummary((CaptureSummary *)local_40);
  if ((libithicap_stats == (DnsStats *)0x0) ||
     (bVar2 = DnsStats::IsCaptureStopped(libithicap_stats), bVar2)) {
    cs.summary.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = -1;
  }
  else {
    DnsStats::StopCapture(libithicap_stats);
    bVar2 = DnsStats::ExportToCaptureSummary(libithicap_stats,(CaptureSummary *)local_40);
    if (bVar2) {
      bVar2 = CaptureSummary::Save((CaptureSummary *)local_40,libithicap_out_file);
      if (!bVar2) {
        if (logerr != (logerr_t *)0x0) {
          (*logerr)("libithicap cannot save the capture summary on <%s>.\n",libithicap_out_file);
        }
        cs.summary.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = -1;
      }
    }
    else {
      if (logerr != (logerr_t *)0x0) {
        (*logerr)("libithicap cannot process the capture summary.\n");
      }
      cs.summary.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = -1;
    }
  }
  iVar1 = cs.summary.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_;
  CaptureSummary::~CaptureSummary((CaptureSummary *)local_40);
  return iVar1;
}

Assistant:

int libithicap_close(my_bpftimeval ts)
    {
        int exit_code = 0;
        CaptureSummary cs;

        UNREFERENCED_PARAMETER(ts);

        if (libithicap_stats == NULL ||
            libithicap_stats->IsCaptureStopped()) {
            exit_code = -1;
        } else {
            libithicap_stats->StopCapture();

            if (!libithicap_stats->ExportToCaptureSummary(&cs))
            {

                if (logerr != NULL)
                {
                    logerr("libithicap cannot process the capture summary.\n");
                }
                exit_code = -1;

            }
            else if (!cs.Save(libithicap_out_file))
            {
                if (logerr != NULL)
                {
                    logerr("libithicap cannot save the capture summary on <%s>.\n",
                        libithicap_out_file);
                }
                exit_code = -1;
            }
        }
        return exit_code;
    }